

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util_test.cc
# Opt level: O1

void __thiscall
FileTest_Get_One_Line_Test::~FileTest_Get_One_Line_Test(FileTest_Get_One_Line_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(FileTest, Get_One_Line) {
#ifndef _MSC_VER
  std::string filename = "/tmp/test";
#else
  std::string filename = "../../test";
#endif
  FILE* file_w = OpenFileOrDie(filename.c_str(), "w");
  std::string w_str("apple\n");
  for (int i = 0; i < 3; ++i) {
    fwrite(w_str.c_str(), 1, w_str.size(), file_w);
  }
  Close(file_w);
  FILE* file_r = OpenFileOrDie(filename.c_str(), "r");
  for (int i = 0; i < 3; ++i) {
    std::string r_str;
    GetLine(file_r, r_str);
    EXPECT_EQ(r_str, "apple");
  }
  Close(file_r);
  RemoveFile(filename.c_str());
}